

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOFX_masteringlimiter.c
# Opt level: O3

uint32_t FAPOFXCreateMasteringLimiter
                   (FAPO **pEffect,void *pInitData,uint32_t InitDataByteSize,
                   FAudioMallocFunc customMalloc,FAudioFreeFunc customFree,
                   FAudioReallocFunc customRealloc,uint8_t legacy)

{
  FAPOBase *fapo;
  uint8_t *pParameterBlocks;
  ulong uVar1;
  FAPORegistrationProperties *pRegistrationProperties;
  uint8_t *puVar2;
  FAPOFXMasteringLimiterParameters fxdefault;
  
  fxdefault.Release = 6;
  fxdefault.Loudness = 1000;
  fapo = (FAPOBase *)(*customMalloc)(0xe0);
  pParameterBlocks = (uint8_t *)(*customMalloc)(0x18);
  if (pInitData == (void *)0x0) {
    SDL_memset(pParameterBlocks,0,0x18);
    pInitData = &fxdefault;
    SDL_memcpy(pParameterBlocks,pInitData,8);
    SDL_memcpy(pParameterBlocks + 8,pInitData,8);
    puVar2 = pParameterBlocks + 0x10;
    uVar1 = 8;
  }
  else {
    uVar1 = (ulong)InitDataByteSize;
    SDL_memcpy(pParameterBlocks,pInitData,uVar1);
    SDL_memcpy(pParameterBlocks + uVar1,pInitData,uVar1);
    puVar2 = pParameterBlocks + InitDataByteSize * 2;
  }
  SDL_memcpy(puVar2,pInitData,uVar1);
  pRegistrationProperties = &FXMasteringLimiterProperties_LEGACY;
  SDL_memcpy(&FXMasteringLimiterProperties_LEGACY,&FAPOFX_CLSID_FXMasteringLimiter_LEGACY,0x10);
  SDL_memcpy(&FXMasteringLimiterProperties,&FAPOFX_CLSID_FXMasteringLimiter,0x10);
  if (legacy == '\0') {
    pRegistrationProperties = &FXMasteringLimiterProperties;
  }
  CreateFAPOBaseWithCustomAllocatorEXT
            (fapo,pRegistrationProperties,pParameterBlocks,8,'\0',customMalloc,customFree,
             customRealloc);
  (fapo->base).Initialize = FAPOFXMasteringLimiter_Initialize;
  (fapo->base).Process = FAPOFXMasteringLimiter_Process;
  fapo->Destructor = FAPOFXMasteringLimiter_Free;
  *pEffect = (FAPO *)fapo;
  return 0;
}

Assistant:

uint32_t FAPOFXCreateMasteringLimiter(
	FAPO **pEffect,
	const void *pInitData,
	uint32_t InitDataByteSize,
	FAudioMallocFunc customMalloc,
	FAudioFreeFunc customFree,
	FAudioReallocFunc customRealloc,
	uint8_t legacy
) {
	const FAPOFXMasteringLimiterParameters fxdefault =
	{
		FAPOFXMASTERINGLIMITER_DEFAULT_RELEASE,
		FAPOFXMASTERINGLIMITER_DEFAULT_LOUDNESS
	};

	/* Allocate... */
	FAPOFXMasteringLimiter *result = (FAPOFXMasteringLimiter*) customMalloc(
		sizeof(FAPOFXMasteringLimiter)
	);
	uint8_t *params = (uint8_t*) customMalloc(
		sizeof(FAPOFXMasteringLimiterParameters) * 3
	);
	if (pInitData == NULL)
	{
		FAudio_zero(params, sizeof(FAPOFXMasteringLimiterParameters) * 3);
		#define INITPARAMS(offset) \
			FAudio_memcpy( \
				params + sizeof(FAPOFXMasteringLimiterParameters) * offset, \
				&fxdefault, \
				sizeof(FAPOFXMasteringLimiterParameters) \
			);
		INITPARAMS(0)
		INITPARAMS(1)
		INITPARAMS(2)
		#undef INITPARAMS
	}
	else
	{
		FAudio_assert(InitDataByteSize == sizeof(FAPOFXMasteringLimiterParameters));
		FAudio_memcpy(params, pInitData, InitDataByteSize);
		FAudio_memcpy(params + InitDataByteSize, pInitData, InitDataByteSize);
		FAudio_memcpy(params + (InitDataByteSize * 2), pInitData, InitDataByteSize);
	}

	/* Initialize... */
	FAudio_memcpy(
		&FXMasteringLimiterProperties_LEGACY.clsid,
		&FAPOFX_CLSID_FXMasteringLimiter_LEGACY,
		sizeof(FAudioGUID)
	);
	FAudio_memcpy(
		&FXMasteringLimiterProperties.clsid,
		&FAPOFX_CLSID_FXMasteringLimiter,
		sizeof(FAudioGUID)
	);
	CreateFAPOBaseWithCustomAllocatorEXT(
		&result->base,
		legacy ? &FXMasteringLimiterProperties_LEGACY : &FXMasteringLimiterProperties,
		params,
		sizeof(FAPOFXMasteringLimiterParameters),
		0,
		customMalloc,
		customFree,
		customRealloc
	);

	/* Function table... */
	result->base.base.Initialize = (InitializeFunc)
		FAPOFXMasteringLimiter_Initialize;
	result->base.base.Process = (ProcessFunc)
		FAPOFXMasteringLimiter_Process;
	result->base.Destructor = FAPOFXMasteringLimiter_Free;

	/* Finally. */
	*pEffect = &result->base.base;
	return 0;
}